

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<2,_0,_5,_0,_2>::evaluate
               (ShaderEvalContext *evalCtx)

{
  bool bVar1;
  bool bVar2;
  float *pfVar3;
  undefined8 *puVar4;
  bool bVar5;
  long lVar6;
  float v;
  float fVar7;
  float fVar8;
  float local_3c [5];
  undefined1 local_28 [8];
  undefined8 uStack_20;
  int aiStack_18 [6];
  
  local_28 = (undefined1  [8])_s_constInMat2;
  uStack_20 = _DAT_0224ba58;
  local_3c[1] = 0.0;
  local_3c[0] = 0.0;
  pfVar3 = local_3c + 1;
  puVar4 = (undefined8 *)local_28;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    fVar7 = 0.0;
    lVar6 = 0;
    fVar8 = DAT_0224ba08;
    bVar1 = true;
    do {
      bVar5 = bVar1;
      fVar7 = fVar7 + fVar8 * *(float *)(puVar4 + lVar6);
      lVar6 = 1;
      fVar8 = DAT_0224ba0c;
      bVar1 = false;
    } while (bVar5);
    *pfVar3 = fVar7;
    pfVar3 = local_3c;
    puVar4 = (undefined8 *)((long)local_28 + 4);
    bVar1 = false;
  } while (bVar2);
  local_3c[2] = local_3c[1];
  local_3c[3] = local_3c[0];
  local_3c[4] = local_3c[1];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar6 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar6]] = local_3c[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 5);
  return;
}

Assistant:

Matrix<T, Rows, Cols>& Matrix<T, Rows, Cols>::operator= (const Matrix<T, Rows, Cols>& src)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src(row, col);
	return *this;
}